

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O2

void audit_regressor_interaction(audit_regressor_data *dat,audit_strings *f)

{
  bool bVar1;
  string ns_pre;
  
  if (f != (audit_strings *)0x0) {
    ns_pre._M_dataplus._M_p = (pointer)&ns_pre.field_2;
    ns_pre._M_string_length = 0;
    ns_pre.field_2._M_local_buf[0] = '\0';
    if ((dat->ns_pre->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (dat->ns_pre->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::push_back((char)&ns_pre);
    }
    bVar1 = std::operator!=(&f->first,"");
    if (bVar1) {
      bVar1 = std::operator!=(&f->first," ");
      if (bVar1) {
        std::__cxx11::string::append((string *)&ns_pre);
        std::__cxx11::string::push_back((char)&ns_pre);
      }
    }
    bVar1 = std::operator!=(&f->second,"");
    if (bVar1) {
      std::__cxx11::string::append((string *)&ns_pre);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(dat->ns_pre,&ns_pre);
    }
    std::__cxx11::string::~string((string *)&ns_pre);
    return;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(dat->ns_pre);
  return;
}

Assistant:

inline void audit_regressor_interaction(audit_regressor_data& dat, const audit_strings* f)
{
  // same as audit_interaction in gd.cc
  if (f == nullptr)
  {
    dat.ns_pre->pop_back();
    return;
  }

  string ns_pre;
  if (!dat.ns_pre->empty())
    ns_pre += '*';

  if (f->first != "" && ((f->first) != " "))
  {
    ns_pre.append(f->first);
    ns_pre += '^';
  }
  if (f->second != "")
  {
    ns_pre.append(f->second);
    dat.ns_pre->push_back(ns_pre);
  }
}